

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O0

void __thiscall slang::ast::ScriptSession::ScriptSession(ScriptSession *this,Bag *options)

{
  LookupLocation lookupLocation;
  CompilationUnitSymbol *astCtx;
  long lVar1;
  EvalContext *in_RDI;
  SourceLibrary *in_stack_00001218;
  Bag *in_stack_00001220;
  Compilation *in_stack_00001228;
  Bag *in_stack_ffffffffffffff58;
  Compilation *in_stack_ffffffffffffff60;
  ASTContext *in_stack_ffffffffffffff68;
  bitmask<slang::ast::ASTFlags> flags;
  Scope *pSVar2;
  EvalContext *pEVar3;
  bitmask<slang::ast::EvalFlags> flags_00;
  bitmask<slang::ast::EvalFlags> local_41;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffc0;
  
  pEVar3 = in_RDI;
  Bag::Bag((Bag *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  flags_00.m_bits = (underlying_type)((ulong)pEVar3 >> 0x38);
  createOptions((Bag *)in_stack_ffffffffffffff60);
  Compilation::Compilation(in_stack_00001228,in_stack_00001220,in_stack_00001218);
  pEVar3 = in_RDI + 3;
  astCtx = Compilation::createScriptScope(in_stack_ffffffffffffff60);
  *(CompilationUnitSymbol **)
   ((pEVar3->warnings).super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.firstElement + 0x40) = astCtx;
  flags.m_bits = (underlying_type)
                 (in_RDI[3].warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement + 0x48);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::vector((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
            *)0x748119);
  pSVar2 = (Scope *)(in_RDI[3].warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                     super_SmallVectorBase<slang::Diagnostic>.firstElement + 0x60);
  lVar1 = *(long *)(in_RDI[3].warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement + 0x40) + 0x40;
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffc0,None);
  lookupLocation._8_8_ = lVar1;
  lookupLocation.scope = pSVar2;
  ASTContext::ASTContext
            (in_stack_ffffffffffffff68,(Scope *)in_stack_ffffffffffffff60,lookupLocation,flags);
  bitmask<slang::ast::EvalFlags>::bitmask(&local_41,IsScript);
  EvalContext::EvalContext(in_RDI,(ASTContext *)astCtx,flags_00);
  EvalContext::pushEmptyFrame((EvalContext *)in_stack_ffffffffffffffc0.m_bits);
  return;
}

Assistant:

ScriptSession::ScriptSession(Bag options) :
    options(std::move(options)), compilation(createOptions(this->options)),
    scope(compilation.createScriptScope()), astCtx(scope, LookupLocation::max),
    evalContext(astCtx, EvalFlags::IsScript) {
    evalContext.pushEmptyFrame();
}